

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O3

int32_t __thiscall icu_63::JapaneseCalendar::handleGetExtendedYear(JapaneseCalendar *this)

{
  uint in_EAX;
  UCalendarDateFields UVar1;
  int32_t iVar2;
  int32_t *piVar3;
  int32_t iVar4;
  UErrorCode status;
  undefined8 uStack_18;
  
  iVar4 = 1;
  uStack_18._0_4_ = in_EAX;
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if ((UVar1 == UCAL_EXTENDED_YEAR) &&
     (UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_ERA),
     UVar1 == UCAL_EXTENDED_YEAR)) {
    if (0 < (this->super_GregorianCalendar).super_Calendar.fStamp[0x13]) {
      return (this->super_GregorianCalendar).super_Calendar.fFields[0x13];
    }
    return 0x7b2;
  }
  uStack_18 = (ulong)(uint)uStack_18;
  piVar3 = (this->super_GregorianCalendar).super_Calendar.fFields;
  if ((this->super_GregorianCalendar).super_Calendar.fStamp[0] < 1) {
    piVar3 = &gCurrentEra;
  }
  iVar2 = EraRules::getStartYear(gJapaneseEraRules,*piVar3,(UErrorCode *)((long)&uStack_18 + 4));
  if (0 < (this->super_GregorianCalendar).super_Calendar.fStamp[1]) {
    iVar4 = (this->super_GregorianCalendar).super_Calendar.fFields[1];
  }
  return iVar2 + iVar4 + -1;
}

Assistant:

int32_t JapaneseCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in JapaneseCalendar is a Gregorian year
    // The default value of EXTENDED_YEAR is 1970 (Showa 45)
    int32_t year;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR &&
        newerField(UCAL_EXTENDED_YEAR, UCAL_ERA) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        UErrorCode status = U_ZERO_ERROR;
        int32_t eraStartYear = gJapaneseEraRules->getStartYear(internalGet(UCAL_ERA, gCurrentEra), status);
        U_ASSERT(U_SUCCESS(status));

        // extended year is a gregorian year, where 1 = 1AD,  0 = 1BC, -1 = 2BC, etc
        year = internalGet(UCAL_YEAR, 1)    // pin to minimum of year 1 (first year)
            + eraStartYear                  // add gregorian starting year
            - 1;                            // Subtract one because year starts at 1
    }
    return year;
}